

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_destroy(uv_stream_t *stream)

{
  int iVar1;
  uv_stream_t *stream_local;
  
  iVar1 = uv__io_active(&stream->io_watcher,5);
  if (iVar1 != 0) {
    __assert_fail("!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1bb,"void uv__stream_destroy(uv_stream_t *)");
  }
  if ((stream->flags & 2) == 0) {
    __assert_fail("stream->flags & UV_CLOSED",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x1bc,"void uv__stream_destroy(uv_stream_t *)");
  }
  if (stream->connect_req != (uv_connect_t *)0x0) {
    if (stream->loop->active_reqs == (void **)stream->loop->active_reqs[0]) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x1bf,"void uv__stream_destroy(uv_stream_t *)");
    }
    *(void **)stream->connect_req->active_queue[1] = stream->connect_req->active_queue[0];
    *(void **)((long)stream->connect_req->active_queue[0] + 8) =
         stream->connect_req->active_queue[1];
    (*stream->connect_req->cb)(stream->connect_req,-0x7d);
    stream->connect_req = (uv_connect_t *)0x0;
  }
  uv__stream_flush_write_queue(stream,-0x7d);
  uv__write_callbacks(stream);
  if (stream->shutdown_req != (uv_shutdown_t *)0x0) {
    if (stream->loop->active_reqs == (void **)stream->loop->active_reqs[0]) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x1cd,"void uv__stream_destroy(uv_stream_t *)");
    }
    *(void **)stream->shutdown_req->active_queue[1] = stream->shutdown_req->active_queue[0];
    *(void **)((long)stream->shutdown_req->active_queue[0] + 8) =
         stream->shutdown_req->active_queue[1];
    (*stream->shutdown_req->cb)(stream->shutdown_req,-0x7d);
    stream->shutdown_req = (uv_shutdown_t *)0x0;
  }
  if (stream->write_queue_size == 0) {
    return;
  }
  __assert_fail("stream->write_queue_size == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                ,0x1d2,"void uv__stream_destroy(uv_stream_t *)");
}

Assistant:

void uv__stream_destroy(uv_stream_t* stream) {
  assert(!uv__io_active(&stream->io_watcher, POLLIN | POLLOUT));
  assert(stream->flags & UV_CLOSED);

  if (stream->connect_req) {
    uv__req_unregister(stream->loop, stream->connect_req);
    stream->connect_req->cb(stream->connect_req, -ECANCELED);
    stream->connect_req = NULL;
  }

  uv__stream_flush_write_queue(stream, -ECANCELED);
  uv__write_callbacks(stream);

  if (stream->shutdown_req) {
    /* The ECANCELED error code is a lie, the shutdown(2) syscall is a
     * fait accompli at this point. Maybe we should revisit this in v0.11.
     * A possible reason for leaving it unchanged is that it informs the
     * callee that the handle has been destroyed.
     */
    uv__req_unregister(stream->loop, stream->shutdown_req);
    stream->shutdown_req->cb(stream->shutdown_req, -ECANCELED);
    stream->shutdown_req = NULL;
  }

  assert(stream->write_queue_size == 0);
}